

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_context.cpp
# Opt level: O0

void cppcms::http::context::dispatch
               (intrusive_ptr<cppcms::application> *app,string *url,bool syncronous)

{
  byte bVar1;
  cached_settings *pcVar2;
  application *paVar3;
  byte in_DL;
  string *in_RSI;
  intrusive_ptr<cppcms::application> *in_RDI;
  request_forgery_error *e;
  application *in_stack_fffffffffffffe28;
  undefined7 in_stack_fffffffffffffe40;
  undefined1 in_stack_fffffffffffffe47;
  application *in_stack_fffffffffffffe58;
  undefined4 in_stack_fffffffffffffe68;
  io_mode_type in_stack_fffffffffffffe6c;
  response *in_stack_fffffffffffffe70;
  context *in_stack_fffffffffffffe90;
  context *in_stack_fffffffffffffea0;
  __shared_ptr local_a0 [72];
  session_interface *in_stack_ffffffffffffffa8;
  string local_48 [55];
  byte local_11;
  string *local_10;
  intrusive_ptr<cppcms::application> *local_8;
  
  local_11 = in_DL & 1;
  local_10 = in_RSI;
  local_8 = in_RDI;
  if (local_11 == 0) {
    booster::intrusive_ptr<cppcms::application>::operator->(in_RDI);
    application::response((application *)0x3a1a91);
    http::response::io_mode(in_stack_fffffffffffffe70,in_stack_fffffffffffffe6c);
  }
  else {
    booster::intrusive_ptr<cppcms::application>::operator->(in_RDI);
    application::response((application *)0x3a1974);
    http::response::io_mode(in_stack_fffffffffffffe70,in_stack_fffffffffffffe6c);
    booster::intrusive_ptr<cppcms::application>::operator->(local_8);
    application::context
              ((application *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
    service((context *)0x3a19ca);
    pcVar2 = cppcms::service::cached_settings((service *)0x3a19e1);
    if (((pcVar2->session).disable_automatic_load & 1U) == 0) {
      booster::intrusive_ptr<cppcms::application>::operator->(local_8);
      application::context
                ((application *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
      session((context *)CONCAT17(in_stack_fffffffffffffe47,in_stack_fffffffffffffe40));
      session_interface::load(in_stack_ffffffffffffffa8);
    }
  }
  if ((local_11 & 1) != 0) {
    booster::intrusive_ptr<cppcms::application>::operator->(local_8);
    application::context
              ((application *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
    service((context *)0x3a1afa);
    pcVar2 = cppcms::service::cached_settings((service *)0x3a1b11);
    if (((pcVar2->session).disable_automatic_load & 1U) == 0) {
      booster::intrusive_ptr<cppcms::application>::operator->(local_8);
      application::context
                ((application *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
      session((context *)CONCAT17(in_stack_fffffffffffffe47,in_stack_fffffffffffffe40));
      session_interface::load(in_stack_ffffffffffffffa8);
    }
  }
  paVar3 = booster::intrusive_ptr<cppcms::application>::operator->(local_8);
  std::__cxx11::string::string(local_48,local_10);
  (*paVar3->_vptr_application[2])(paVar3,local_48);
  std::__cxx11::string::~string(local_48);
  booster::intrusive_ptr<cppcms::application>::operator->(local_8);
  application::get_context(in_stack_fffffffffffffe28);
  bVar1 = std::__shared_ptr::operator_cast_to_bool(local_a0);
  std::shared_ptr<cppcms::http::context>::~shared_ptr((shared_ptr<cppcms::http::context> *)0x3a1e96)
  ;
  if ((bVar1 & 1) != 0) {
    if ((local_11 & 1) == 0) {
      booster::intrusive_ptr<cppcms::application>::operator->(local_8);
      application::context
                ((application *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
      async_complete_response(in_stack_fffffffffffffe90);
    }
    else {
      booster::intrusive_ptr<cppcms::application>::operator->(local_8);
      application::context
                ((application *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
      complete_response(in_stack_fffffffffffffea0);
    }
    booster::intrusive_ptr<cppcms::application>::operator->(local_8);
    application::release_context(in_stack_fffffffffffffe58);
    std::shared_ptr<cppcms::http::context>::~shared_ptr
              ((shared_ptr<cppcms::http::context> *)0x3a1fcd);
  }
  return;
}

Assistant:

void context::dispatch(booster::intrusive_ptr<application> const &app,std::string const &url,bool syncronous)
{
	try {
		if(syncronous) {
			app->response().io_mode(http::response::normal);
			if(!app->context().service().cached_settings().session.disable_automatic_load)
				app->context().session().load();
		}
		else {
			app->response().io_mode(http::response::asynchronous);
		}

		if(syncronous && !app->context().service().cached_settings().session.disable_automatic_load)
			app->context().session().load();
		app->main(url);
	}
	catch(request_forgery_error const &e) {
		if(app->get_context() && !app->response().some_output_was_written()) {
			app->response().make_error_response(http::response::forbidden);
		}
	}
	catch(...){
		if(app->get_context())
			app->context().translate_exception();
	}
	
	if(app->get_context()) {
		try {
			if(syncronous) {
				app->context().complete_response();
			}
			else  {
				app->context().async_complete_response();
			}
		}
		catch(...) {
			app->release_context();
			throw;
		}
		app->release_context();
	}
}